

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

Vec_Int_t *
Wlc_NtkGetCoreSels(Gia_Man_t *pFrames,int nFrames,int first_sel_pi,int num_sel_pis,Vec_Bit_t *vMark,
                  int nConfLimit,Wlc_Par_t *pPars,int fSetPO,int RunId)

{
  long lVar1;
  Vec_Int_t *p;
  sat_solver *psVar2;
  int iVar3;
  int iVar4;
  lit Entry;
  int iVar5;
  Aig_Man_t *pAVar6;
  int *piVar7;
  int *piVar8;
  Aig_Obj_t *pAVar9;
  int *local_a0;
  int *pCoreLits;
  int nCoreLits;
  int Lit_1;
  int var;
  int cur_pi;
  Vec_Int_t *vMapVar2Sel;
  Vec_Int_t *vLits_1;
  int status;
  int Lit;
  int ret;
  int i_1;
  Aig_Obj_t *pObj;
  Vec_Int_t *vLits;
  sat_solver *psStack_50;
  int i;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Aig_Man_t *pAigFrames;
  Vec_Int_t *vCores;
  Vec_Bit_t *pVStack_28;
  int nConfLimit_local;
  Vec_Bit_t *vMark_local;
  int local_18;
  int num_sel_pis_local;
  int first_sel_pi_local;
  int nFrames_local;
  Gia_Man_t *pFrames_local;
  
  pAigFrames = (Aig_Man_t *)0x0;
  vCores._4_4_ = nConfLimit;
  pVStack_28 = vMark;
  vMark_local._4_4_ = num_sel_pis;
  local_18 = first_sel_pi;
  num_sel_pis_local = nFrames;
  _first_sel_pi_local = pFrames;
  pAVar6 = Gia_ManToAigSimple(pFrames);
  pCnf = (Cnf_Dat_t *)pAVar6;
  iVar3 = Aig_ManCoNum(pAVar6);
  pSat = (sat_solver *)Cnf_Derive(pAVar6,iVar3);
  psStack_50 = sat_solver_new();
  sat_solver_setnvars(psStack_50,pSat->qhead);
  if (-1 < RunId) {
    sat_solver_set_runid(psStack_50,RunId);
    sat_solver_set_stop_func(psStack_50,Wla_CallBackToStop);
  }
  vLits._4_4_ = 0;
  while( true ) {
    if ((pSat->Mem).nEntries[0] <= vLits._4_4_) {
      pObj = (Aig_Obj_t *)Vec_IntAlloc(100);
      for (Lit = 0; iVar3 = Lit, iVar4 = Vec_PtrSize((Vec_Ptr_t *)pCnf->pClauses),
          psVar2 = psStack_50, iVar3 < iVar4; Lit = Lit + 1) {
        _ret = Vec_PtrEntry((Vec_Ptr_t *)pCnf->pClauses,Lit);
        pAVar9 = pObj;
        if (*(int *)(*(long *)(pSat->Mem).BookMarkE + (long)*(int *)((long)_ret + 0x24) * 4) < 0) {
          __assert_fail("pCnf->pVarNums[pObj->Id] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs.c"
                        ,0xf3,
                        "Vec_Int_t *Wlc_NtkGetCoreSels(Gia_Man_t *, int, int, int, Vec_Bit_t *, int, Wlc_Par_t *, int, int)"
                       );
        }
        Entry = toLitCond(*(int *)(*(long *)(pSat->Mem).BookMarkE +
                                  (long)*(int *)((long)_ret + 0x24) * 4),0);
        Vec_IntPush((Vec_Int_t *)pAVar9,Entry);
      }
      if (fSetPO == 0) {
        piVar7 = Vec_IntArray((Vec_Int_t *)pObj);
        piVar8 = Vec_IntArray((Vec_Int_t *)pObj);
        iVar3 = Vec_IntSize((Vec_Int_t *)pObj);
        status = sat_solver_addclause(psVar2,piVar7,piVar8 + iVar3);
        if (status == 0) {
          Abc_Print(1,"UNSAT after adding PO clauses.\n");
        }
      }
      else {
        for (Lit = 0; iVar3 = Lit, iVar5 = Vec_IntSize((Vec_Int_t *)pObj), iVar4 = Lit,
            iVar3 < iVar5; Lit = Lit + 1) {
          iVar3 = Vec_IntSize((Vec_Int_t *)pObj);
          if (iVar4 == iVar3 + -1) {
            vLits_1._4_4_ = Vec_IntEntry((Vec_Int_t *)pObj,Lit);
          }
          else {
            iVar3 = Vec_IntEntry((Vec_Int_t *)pObj,Lit);
            vLits_1._4_4_ = lit_neg(iVar3);
          }
          status = sat_solver_addclause(psStack_50,(lit *)((long)&vLits_1 + 4),&status);
          if (status == 0) {
            Abc_Print(1,"UNSAT after adding PO clauses.\n");
          }
        }
      }
      Vec_IntFree((Vec_Int_t *)pObj);
      vMapVar2Sel = Vec_IntAlloc(100);
      _var = Vec_IntStart(pSat->qhead);
      vLits._4_4_ = 0;
      while( true ) {
        psVar2 = psStack_50;
        if (vMark_local._4_4_ <= vLits._4_4_) {
          piVar7 = Vec_IntArray(vMapVar2Sel);
          piVar8 = Vec_IntArray(vMapVar2Sel);
          iVar3 = Vec_IntSize(vMapVar2Sel);
          vLits_1._0_4_ = sat_solver_solve(psVar2,piVar7,piVar8 + iVar3,(long)vCores._4_4_,0,0,0);
          if ((int)vLits_1 == -1) {
            Abc_Print(1,"UNSAT.\n");
            pCoreLits._0_4_ = sat_solver_final(psStack_50,&local_a0);
            pAigFrames = (Aig_Man_t *)Vec_IntAlloc((int)pCoreLits);
            for (vLits._4_4_ = 0; pAVar6 = pAigFrames, p = _var, vLits._4_4_ < (int)pCoreLits;
                vLits._4_4_ = vLits._4_4_ + 1) {
              iVar3 = lit_var(local_a0[vLits._4_4_]);
              iVar3 = Vec_IntEntry(p,iVar3);
              Vec_IntPush((Vec_Int_t *)pAVar6,iVar3);
            }
          }
          else if ((int)vLits_1 == 1) {
            Abc_Print(1,"SAT.\n");
          }
          else {
            Abc_Print(1,"UNKNOWN.\n");
          }
          Vec_IntFree(vMapVar2Sel);
          Vec_IntFree(_var);
          Cnf_ManFree();
          sat_solver_delete(psStack_50);
          Aig_ManStop((Aig_Man_t *)pCnf);
          return (Vec_Int_t *)pAigFrames;
        }
        Lit_1 = local_18 + vLits._4_4_;
        lVar1 = *(long *)(pSat->Mem).BookMarkE;
        pAVar9 = Aig_ManCi((Aig_Man_t *)pCnf,Lit_1);
        nCoreLits = *(int *)(lVar1 + (long)pAVar9->Id * 4);
        if (nCoreLits < 0) break;
        Vec_IntWriteEntry(_var,nCoreLits,vLits._4_4_);
        pCoreLits._4_4_ = toLitCond(nCoreLits,0);
        iVar3 = Vec_BitEntry(pVStack_28,vLits._4_4_);
        if (iVar3 == 0) {
          sat_solver_addclause(psStack_50,(lit *)((long)&pCoreLits + 4),&nCoreLits);
        }
        else {
          Vec_IntPush(vMapVar2Sel,pCoreLits._4_4_);
        }
        vLits._4_4_ = vLits._4_4_ + 1;
      }
      __assert_fail("var >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs.c"
                    ,0x118,
                    "Vec_Int_t *Wlc_NtkGetCoreSels(Gia_Man_t *, int, int, int, Vec_Bit_t *, int, Wlc_Par_t *, int, int)"
                   );
    }
    iVar3 = sat_solver_addclause
                      (psStack_50,*(lit **)(*(long *)(pSat->Mem).BookMarkH + (long)vLits._4_4_ * 8),
                       *(lit **)(*(long *)(pSat->Mem).BookMarkH + (long)(vLits._4_4_ + 1) * 8));
    if (iVar3 == 0) break;
    vLits._4_4_ = vLits._4_4_ + 1;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs.c"
                ,0xea,
                "Vec_Int_t *Wlc_NtkGetCoreSels(Gia_Man_t *, int, int, int, Vec_Bit_t *, int, Wlc_Par_t *, int, int)"
               );
}

Assistant:

static Vec_Int_t * Wlc_NtkGetCoreSels( Gia_Man_t * pFrames, int nFrames, int first_sel_pi, int num_sel_pis, Vec_Bit_t * vMark, int nConfLimit, Wlc_Par_t * pPars, int fSetPO, int RunId ) 
{
    Vec_Int_t * vCores = NULL;
    Aig_Man_t * pAigFrames = Gia_ManToAigSimple( pFrames );
    Cnf_Dat_t * pCnf = Cnf_Derive(pAigFrames, Aig_ManCoNum(pAigFrames));
    sat_solver * pSat = sat_solver_new();
    int i;

    sat_solver_setnvars(pSat, pCnf->nVars);
    if ( RunId >= 0 )
    {
        sat_solver_set_runid( pSat, RunId );
        sat_solver_set_stop_func( pSat, Wla_CallBackToStop );
    }

    for (i = 0; i < pCnf->nClauses; i++) 
    {
        if (!sat_solver_addclause(pSat, pCnf->pClauses[i], pCnf->pClauses[i + 1]))
            assert(false);
    }
    // add PO clauses
    {
        Vec_Int_t* vLits = Vec_IntAlloc(100);
        Aig_Obj_t* pObj;
        int i, ret;
        Aig_ManForEachCo( pAigFrames, pObj, i )
        {
            assert(pCnf->pVarNums[pObj->Id] >= 0);
            Vec_IntPush(vLits, toLitCond(pCnf->pVarNums[pObj->Id], 0));
        }
        if ( !fSetPO )
        {
            ret = sat_solver_addclause(pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits));
            if (!ret) 
                Abc_Print( 1, "UNSAT after adding PO clauses.\n" );
        }
        else
        {
            int Lit;
            for ( i = 0; i < Vec_IntSize(vLits); ++i )
            {
                if ( i == Vec_IntSize(vLits) - 1 )
                    Lit = Vec_IntEntry( vLits, i );
                else
                    Lit = lit_neg(Vec_IntEntry( vLits, i ));
                ret = sat_solver_addclause(pSat, &Lit, &Lit + 1);
                if (!ret) 
                    Abc_Print( 1, "UNSAT after adding PO clauses.\n" );
            }
        }

        Vec_IntFree(vLits);
    }
    
    // main procedure
    {
        int status;
        Vec_Int_t* vLits = Vec_IntAlloc(100);
        Vec_Int_t* vMapVar2Sel = Vec_IntStart( pCnf->nVars );
        for ( i = 0; i < num_sel_pis; ++i ) 
        {
            int cur_pi = first_sel_pi + i;
            int var = pCnf->pVarNums[Aig_ManCi(pAigFrames, cur_pi)->Id];
            int Lit;
            assert(var >= 0);
            Vec_IntWriteEntry( vMapVar2Sel, var, i );
            Lit = toLitCond( var, 0 );
            if ( Vec_BitEntry( vMark, i ) )
                Vec_IntPush(vLits, Lit);
            else
                sat_solver_addclause( pSat, &Lit, &Lit+1 );
        }
        /*
            int i, Entry;
            Abc_Print( 1, "#vLits = %d; vLits = ", Vec_IntSize(vLits) );
            Vec_IntForEachEntry(vLits, Entry, i)
                Abc_Print( 1, "%d ", Entry);
            Abc_Print( 1, "\n");
        */
        status = sat_solver_solve(pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)(nConfLimit), (ABC_INT64_T)(0), (ABC_INT64_T)(0), (ABC_INT64_T)(0));
        if (status == l_False) {
            int nCoreLits, *pCoreLits;
            Abc_Print( 1, "UNSAT.\n" );
            nCoreLits = sat_solver_final(pSat, &pCoreLits);
            vCores = Vec_IntAlloc( nCoreLits );
            for (i = 0; i < nCoreLits; i++) 
            {
                Vec_IntPush( vCores, Vec_IntEntry( vMapVar2Sel, lit_var( pCoreLits[i] ) ) );
            }
        } else if (status == l_True) {
            Abc_Print( 1, "SAT.\n" );
        } else {
            Abc_Print( 1, "UNKNOWN.\n" );
        }

        Vec_IntFree(vLits);
        Vec_IntFree(vMapVar2Sel);
    }
    Cnf_ManFree();
    sat_solver_delete(pSat);
    Aig_ManStop(pAigFrames);

    return vCores;
}